

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes ReadBitVector(CSzData *sd,UInt32 numItems,Byte **v,ISzAlloc *alloc)

{
  char *pcVar1;
  void *__s;
  uint uVar2;
  long lVar3;
  sbyte sVar4;
  undefined8 *in_RCX;
  long *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uint numBits;
  UInt32 numBytes;
  Byte *v2;
  Byte allAreDefined;
  SRes local_4;
  
  uVar2 = in_ESI + 7 >> 3;
  *in_RDX = 0;
  if (in_RDI[1] == 0) {
    local_4 = 0x10;
  }
  else {
    in_RDI[1] = in_RDI[1] + -1;
    pcVar1 = (char *)*in_RDI;
    *in_RDI = (long)(pcVar1 + 1);
    if (uVar2 == 0) {
      local_4 = 0;
    }
    else if (*pcVar1 == '\0') {
      if ((ulong)in_RDI[1] < (ulong)uVar2) {
        local_4 = 0x10;
      }
      else {
        lVar3 = (*(code *)*in_RCX)(in_RCX,uVar2);
        *in_RDX = lVar3;
        if (lVar3 == 0) {
          local_4 = 2;
        }
        else {
          memcpy((void *)*in_RDX,(void *)*in_RDI,(ulong)uVar2);
          in_RDI[1] = in_RDI[1] - (ulong)uVar2;
          *in_RDI = (ulong)uVar2 + *in_RDI;
          local_4 = 0;
        }
      }
    }
    else {
      lVar3 = (*(code *)*in_RCX)(in_RCX,uVar2);
      *in_RDX = lVar3;
      if (lVar3 == 0) {
        local_4 = 2;
      }
      else {
        __s = (void *)*in_RDX;
        memset(__s,0xff,(ulong)uVar2);
        if ((in_ESI & 7) != 0) {
          sVar4 = (sbyte)(in_ESI & 7);
          *(char *)((long)__s + (ulong)(uVar2 - 1)) =
               (char)((1 << sVar4) + -1 << (8U - sVar4 & 0x1f));
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static MY_NO_INLINE SRes ReadBitVector(CSzData *sd, UInt32 numItems, Byte **v, ISzAlloc *alloc)
{
  Byte allAreDefined;
  Byte *v2;
  UInt32 numBytes = (numItems + 7) >> 3;
  *v = NULL;
  SZ_READ_BYTE(allAreDefined);
  if (numBytes == 0)
    return SZ_OK;
  if (allAreDefined == 0)
  {
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    MY_ALLOC_AND_CPY(*v, numBytes, sd->Data, alloc);
    SKIP_DATA(sd, numBytes);
    return SZ_OK;
  }
  MY_ALLOC(Byte, *v, numBytes, alloc);
  v2 = *v;
  memset(v2, 0xFF, (size_t)numBytes);
  {
    unsigned numBits = (unsigned)numItems & 7;
    if (numBits != 0)
      v2[numBytes - 1] = (Byte)((((UInt32)1 << numBits) - 1) << (8 - numBits));
  }
  return SZ_OK;
}